

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void mkportal(level *lev,xchar x,xchar y,xchar todnum,xchar todlevel)

{
  trap *ptVar1;
  trap *ttmp;
  xchar todlevel_local;
  xchar todnum_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  ptVar1 = maketrap(lev,(int)x,(int)y,0x12);
  if (ptVar1 == (trap *)0x0) {
    impossible("portal on top of portal??");
  }
  else {
    (ptVar1->dst).dnum = todnum;
    (ptVar1->dst).dlevel = todlevel;
  }
  return;
}

Assistant:

void mkportal(struct level *lev, xchar x, xchar y, xchar todnum, xchar todlevel)
{
	/* a portal "trap" must be matched by a */
	/* portal in the destination dungeon/dlevel */
	struct trap *ttmp = maketrap(lev, x, y, MAGIC_PORTAL);

	if (!ttmp) {
		impossible("portal on top of portal??");
		return;
	}
	ttmp->dst.dnum = todnum;
	ttmp->dst.dlevel = todlevel;
	return;
}